

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::updateButtonLayout(QWizardPrivate *this)

{
  uint uVar1;
  long lVar2;
  const_iterator first;
  char *pcVar3;
  QVarLengthArray<QWizard::WizardButton,_9LL> *pQVar4;
  long in_FS_OFFSET;
  QVarLengthArray<QWizard::WizardButton,_9LL> array;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->buttonsHaveCustomLayout == true) {
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    array._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.ptr = &DAT_aaaaaaaaaaaaaaaa;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.a =
         (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s =
         (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    first.i = (this->buttonsCustomLayout).d.ptr;
    QVarLengthArray<QWizard::WizardButton,_9LL>::
    QVarLengthArray<QList<QWizard::WizardButton>::const_iterator,_true>
              (&array,first,(const_iterator)(first.i + (this->buttonsCustomLayout).d.size));
    setButtonLayout(this,(WizardButton *)
                         array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.ptr,
                    (int)array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s);
    QVarLengthArray<QWizard::WizardButton,_9LL>::~QVarLengthArray(&array);
  }
  else {
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x10] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x11] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x12] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x13] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x14] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x15] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x16] = -1;
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0x17] = -1;
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.ptr = (void *)0xffffffffffffffff;
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.a._0_4_ = 0xffffffff;
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s = -1;
    uVar1 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
            super_QFlagsStorage<QWizard::WizardOption>.i;
    if ((uVar1 >> 0xb & 1) != 0) {
      pQVar4 = &array;
      if ((uVar1 >> 0xc & 1) != 0) {
        pQVar4 = (QVarLengthArray<QWizard::WizardButton,_9LL> *)
                 (array.super_QVLAStorage<4UL,_4UL,_9LL>.array + 0x14);
      }
      *(char *)((long)pQVar4 + 0) = '\x05';
      *(char *)((long)pQVar4 + 1) = '\0';
      *(char *)((long)pQVar4 + 2) = '\0';
      *(char *)((long)pQVar4 + 3) = '\0';
    }
    array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.a =
         CONCAT44(9,(undefined4)array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.a);
    if ((uVar1 >> 0xd & 1) != 0) {
      array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s =
           CONCAT44(array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s._4_4_,6);
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s =
           CONCAT44(7,(int)array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.s);
    }
    if ((short)uVar1 < 0) {
      array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.ptr =
           (void *)CONCAT44(array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.ptr._4_4_
                            ,8);
    }
    if ((uVar1 >> 9 & 1) == 0) {
      pcVar3 = (char *)((long)&array.super_QVLABase<QWizard::WizardButton>.super_QVLABaseBase.ptr +
                       4);
      if ((uVar1 >> 10 & 1) == 0) {
        pcVar3 = array.super_QVLAStorage<4UL,_4UL,_9LL>.array + 0x10;
      }
      pcVar3[0] = '\x04';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
    }
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[1] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[2] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[3] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[4] = '\x01';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[5] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[6] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[7] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[8] = '\x02';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[9] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[10] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0xb] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0xc] = '\x03';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0xd] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0xe] = '\0';
    array.super_QVLAStorage<4UL,_4UL,_9LL>.array[0xf] = '\0';
    setButtonLayout(this,(WizardButton *)&array,0xc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updateButtonLayout()
{
    if (buttonsHaveCustomLayout) {
        QVarLengthArray<QWizard::WizardButton, QWizard::NButtons> array{
                buttonsCustomLayout.cbegin(), buttonsCustomLayout.cend()};
        setButtonLayout(array.constData(), int(array.size()));
    } else {
        // Positions:
        //     Help Stretch Custom1 Custom2 Custom3 Cancel Back Next Commit Finish Cancel Help

        const int ArraySize = 12;
        QWizard::WizardButton array[ArraySize];
        memset(array, -1, sizeof(array));
        Q_ASSERT(array[0] == QWizard::NoButton);

        if (opts & QWizard::HaveHelpButton) {
            int i = (opts & QWizard::HelpButtonOnRight) ? 11 : 0;
            array[i] = QWizard::HelpButton;
        }
        array[1] = QWizard::Stretch;
        if (opts & QWizard::HaveCustomButton1)
            array[2] = QWizard::CustomButton1;
        if (opts & QWizard::HaveCustomButton2)
            array[3] = QWizard::CustomButton2;
        if (opts & QWizard::HaveCustomButton3)
            array[4] = QWizard::CustomButton3;

        if (!(opts & QWizard::NoCancelButton)) {
            int i = (opts & QWizard::CancelButtonOnLeft) ? 5 : 10;
            array[i] = QWizard::CancelButton;
        }
        array[6] = QWizard::BackButton;
        array[7] = QWizard::NextButton;
        array[8] = QWizard::CommitButton;
        array[9] = QWizard::FinishButton;

        setButtonLayout(array, ArraySize);
    }
}